

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::Mesh::ConvertToAssimpScene(Mesh *this,aiScene *dest)

{
  uint uVar1;
  Skeleton *this_00;
  pointer ppAVar2;
  pointer ppAVar3;
  pointer ppBVar4;
  aiMesh **ppaVar5;
  aiNode *paVar6;
  uint *puVar7;
  aiMesh *paVar8;
  aiNode **ppaVar9;
  aiAnimation **ppaVar10;
  aiAnimation *paVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  BoneList rootBones;
  BoneList local_48;
  
  if (dest != (aiScene *)0x0) {
    uVar12 = (long)(this->subMeshes).
                   super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->subMeshes).
                   super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    dest->mNumMeshes = (uint)(uVar12 >> 3);
    ppaVar5 = (aiMesh **)operator_new__(uVar12 & 0x7fffffff8);
    dest->mMeshes = ppaVar5;
    paVar6 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar6);
    dest->mRootNode = paVar6;
    uVar1 = dest->mNumMeshes;
    paVar6->mNumMeshes = uVar1;
    puVar7 = (uint *)operator_new__((ulong)uVar1 << 2);
    paVar6->mMeshes = puVar7;
    if (dest->mNumMeshes != 0) {
      uVar12 = 0;
      do {
        paVar8 = SubMesh::ConvertToAssimpMesh
                           ((this->subMeshes).
                            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12],this);
        dest->mMeshes[uVar12] = paVar8;
        dest->mRootNode->mMeshes[uVar12] = (uint)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar12 < dest->mNumMeshes);
    }
    this_00 = this->skeleton;
    if (this_00 != (Skeleton *)0x0) {
      if ((this_00->bones).
          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this_00->bones).
          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        Skeleton::RootBones(&local_48,this_00);
        ppBVar4 = local_48.
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar14 = (long)local_48.
                       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        dest->mRootNode->mNumChildren = (uint)lVar14;
        paVar6 = dest->mRootNode;
        ppaVar9 = (aiNode **)operator_new__((ulong)paVar6->mNumChildren << 3);
        paVar6->mChildren = ppaVar9;
        if (local_48.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppBVar4) {
          lVar13 = 0;
          do {
            paVar6 = Bone::ConvertToAssimpNode
                               (local_48.
                                super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar13],this->skeleton,
                                dest->mRootNode);
            dest->mRootNode->mChildren[lVar13] = paVar6;
            lVar13 = lVar13 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
        }
        if (local_48.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ppAVar2 = (this->skeleton->animations).
                super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppAVar3 = (this->skeleton->animations).
                super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppAVar2 != ppAVar3) {
        uVar12 = (long)ppAVar3 - (long)ppAVar2;
        dest->mNumAnimations = (uint)(uVar12 >> 3);
        ppaVar10 = (aiAnimation **)operator_new__(uVar12 & 0x7fffffff8);
        dest->mAnimations = ppaVar10;
        lVar14 = (long)(this->skeleton->animations).
                       super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->skeleton->animations).
                       super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar14 != 0) {
          lVar14 = lVar14 >> 3;
          lVar13 = 0;
          do {
            paVar11 = Animation::ConvertToAssimpAnimation
                                ((this->skeleton->animations).
                                 super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar13]);
            dest->mAnimations[lVar13] = paVar11;
            lVar13 = lVar13 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
        }
      }
    }
  }
  return;
}

Assistant:

void Mesh::ConvertToAssimpScene(aiScene* dest)
{
    if ( nullptr == dest ) {
        return;
    }

    // Setup
    dest->mNumMeshes = static_cast<unsigned int>(NumSubMeshes());
    dest->mMeshes = new aiMesh*[dest->mNumMeshes];

    // Create root node
    dest->mRootNode = new aiNode();
    dest->mRootNode->mNumMeshes = dest->mNumMeshes;
    dest->mRootNode->mMeshes = new unsigned int[dest->mRootNode->mNumMeshes];

    // Export meshes
    for(size_t i=0; i<dest->mNumMeshes; ++i) {
        dest->mMeshes[i] = subMeshes[i]->ConvertToAssimpMesh(this);
        dest->mRootNode->mMeshes[i] = static_cast<unsigned int>(i);
    }

    // Export skeleton
    if (skeleton)
    {
        // Bones
        if (!skeleton->bones.empty())
        {
            BoneList rootBones = skeleton->RootBones();
            dest->mRootNode->mNumChildren = static_cast<unsigned int>(rootBones.size());
            dest->mRootNode->mChildren = new aiNode*[dest->mRootNode->mNumChildren];

            for(size_t i=0, len=rootBones.size(); i<len; ++i)
            {
                dest->mRootNode->mChildren[i] = rootBones[i]->ConvertToAssimpNode(skeleton, dest->mRootNode);
            }
        }

        // Animations
        if (!skeleton->animations.empty())
        {
            dest->mNumAnimations = static_cast<unsigned int>(skeleton->animations.size());
            dest->mAnimations = new aiAnimation*[dest->mNumAnimations];

            for(size_t i=0, len=skeleton->animations.size(); i<len; ++i)
            {
                dest->mAnimations[i] = skeleton->animations[i]->ConvertToAssimpAnimation();
            }
        }
    }
}